

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

uint64_t __thiscall
fmp4_stream::ingest_stream::get_init_segment_data
          (ingest_stream *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *init_seg_dat)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  uchar *local_58;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  uchar *local_40;
  uchar *local_38;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  size_type local_20;
  uint64_t ssize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *init_seg_dat_local;
  ingest_stream *this_local;
  
  local_20 = (this->init_fragment_).ftyp_box_.large_size_ +
             (this->init_fragment_).moov_box_.large_size_;
  ssize = (uint64_t)init_seg_dat;
  init_seg_dat_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(init_seg_dat,local_20);
  local_28._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (&(this->init_fragment_).ftyp_box_.box_data_);
  local_30._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (&(this->init_fragment_).ftyp_box_.box_data_);
  local_38 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ssize);
  local_40 = (uchar *)std::
                      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                (local_28,local_30,
                                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )local_38);
  local_48._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (&(this->init_fragment_).moov_box_.box_data_);
  local_50._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (&(this->init_fragment_).moov_box_.box_data_);
  local_60._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ssize);
  local_58 = (uchar *)__gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_60,(this->init_fragment_).ftyp_box_.large_size_);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (local_48,local_50,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_58);
  return local_20;
}

Assistant:

uint64_t ingest_stream::get_init_segment_data(std::vector<uint8_t> &init_seg_dat)
	{
		uint64_t ssize = init_fragment_.ftyp_box_.large_size_ + init_fragment_.moov_box_.large_size_;
		init_seg_dat.resize(ssize);

		// hard copy the init segment data to the output vector, as ftyp and moviefragment box need to be combined
		std::copy(init_fragment_.ftyp_box_.box_data_.begin(), 
			      init_fragment_.ftyp_box_.box_data_.end(), 
			      init_seg_dat.begin()
	    );
		std::copy(init_fragment_.moov_box_.box_data_.begin(), 
			      init_fragment_.moov_box_.box_data_.end(), 
			      init_seg_dat.begin() + init_fragment_.ftyp_box_.large_size_
		);

		return ssize;
	}